

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.cc
# Opt level: O2

string * google::protobuf::internal::CloneSlow(Arena *arena,string *value)

{
  string *this;
  
  if (arena == (Arena *)0x0) {
    this = (string *)operator_new(0x20);
    std::__cxx11::string::string((string *)this,(string *)value);
  }
  else {
    this = (string *)ThreadSafeArena::AllocateFromStringBlock(&arena->impl_);
    std::__cxx11::string::string((string *)this,(string *)value);
  }
  return this;
}

Assistant:

std::string* CloneSlow(Arena* arena, const std::string& value) {
  return Arena::Create<std::string>(arena, value);
}